

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Set_block_cyclic64(int g_a,int64_t *dims)

{
  Integer IVar1;
  long in_RSI;
  int in_EDI;
  int i;
  Integer _ga_dims [7];
  Integer ndim;
  Integer aa;
  int local_5c;
  Integer *in_stack_ffffffffffffffa8;
  Integer in_stack_ffffffffffffffb0;
  
  IVar1 = pnga_get_dimension((long)in_EDI);
  for (local_5c = 0; local_5c < IVar1; local_5c = local_5c + 1) {
    *(undefined8 *)(&stack0xffffffffffffffa8 + ((IVar1 - local_5c) + -1) * 8) =
         *(undefined8 *)(in_RSI + (long)local_5c * 8);
  }
  pnga_set_block_cyclic(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void GA_Set_block_cyclic64(int g_a, int64_t dims[])
{
    Integer aa, ndim;
    Integer _ga_dims[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(dims,_ga_dims, ndim);
    wnga_set_block_cyclic(aa, _ga_dims);
}